

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mean.hpp
# Opt level: O2

float __thiscall re::math::mean<float,_1l>(math *this,span<const_float,__1L> input)

{
  float fVar1;
  span<const_float,__1L> input_local;
  span_iterator<gsl::span<const_float,__1L>,_false> local_20;
  span_iterator<gsl::span<const_float,__1L>,_false> local_10;
  
  input_local.storage_.data_ = (pointer)input.storage_.super_extent_type<_1L>.size_;
  input_local.storage_.super_extent_type<_1L>.size_ = (index_type)this;
  if (0 < (long)this) {
    local_20.span_ = &input_local;
    local_10.index_ = 0;
    local_20.index_ = (ptrdiff_t)this;
    local_10.span_ = local_20.span_;
    fVar1 = ::std::accumulate<gsl::details::span_iterator<gsl::span<float_const,_1l>,false>,float>
                      (&local_10,&local_20,0.0);
    return fVar1 / (float)input_local.storage_.super_extent_type<_1L>.size_;
  }
  __assert_fail("std::size(input) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/mean.hpp"
                ,0x12,"T re::math::mean(gsl::span<const T, N>) [T = float, N = -1L]");
}

Assistant:

T
mean(gsl::span<T const, N> input)
noexcept
{
    assert(std::size(input) > 0);
    return std::accumulate(
        std::cbegin(input),
        std::cend(input),
        static_cast<T>(0)
    ) / std::size(input);
}